

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<unsigned_int> *
wasm::WATParser::maybeLabelidx<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<unsigned_int> *__return_storage_ptr__,ParseDefsCtx *ctx,bool inDelegate)

{
  bool *__return_storage_ptr___00;
  optional<unsigned_int> oVar1;
  undefined1 local_70 [8];
  optional<wasm::Name> id;
  
  oVar1 = Lexer::takeU<unsigned_int>(&ctx->in);
  if (((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
    Lexer::takeID((optional<wasm::Name> *)local_70,&ctx->in);
    if (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\x01') {
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).
               super__Variant_base<unsigned_int,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<unsigned_int,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<unsigned_int,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<unsigned_int,_wasm::None,_wasm::Err> + 0x20) = '\x01';
      return __return_storage_ptr__;
    }
    __return_storage_ptr___00 =
         &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::Name>._M_engaged;
    IRBuilder::getLabelIndex
              ((Result<unsigned_int> *)__return_storage_ptr___00,&ctx->irBuilder,_local_70,
               inDelegate);
    MaybeResult<unsigned_int>::MaybeResult<unsigned_int>
              (__return_storage_ptr__,(Result<unsigned_int> *)__return_storage_ptr___00);
  }
  else {
    id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Name>._16_4_ =
         oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload;
    MaybeResult<unsigned_int>::MaybeResult<unsigned_int>
              (__return_storage_ptr__,
               (Result<unsigned_int> *)
               &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
  }
  std::__detail::__variant::_Variant_storage<false,_unsigned_int,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_unsigned_int,_wasm::Err> *)
             &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::Name>._M_engaged);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::LabelIdxT> maybeLabelidx(Ctx& ctx, bool inDelegate) {
  if (auto x = ctx.in.takeU32()) {
    return ctx.getLabelFromIdx(*x, inDelegate);
  }
  if (auto id = ctx.in.takeID()) {
    return ctx.getLabelFromName(*id, inDelegate);
  }
  return {};
}